

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O2

void __thiscall ipx::SparseMatrix::resize(SparseMatrix *this,Int nrow,Int ncol,Int min_capacity)

{
  pointer piVar1;
  pointer piVar2;
  
  this->nrow_ = nrow;
  std::vector<int,_std::allocator<int>_>::resize(&this->colptr_,(long)(ncol + 1));
  std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(&this->colptr_);
  piVar1 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar2 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    *piVar2 = 0;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->rowidx_,(long)min_capacity);
  std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(&this->rowidx_);
  std::vector<double,_std::allocator<double>_>::resize(&this->values_,(long)min_capacity);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&this->values_);
  return;
}

Assistant:

void SparseMatrix::resize(Int nrow, Int ncol, Int min_capacity) {
    assert(nrow >= 0);
    assert(ncol >= 0);
    assert(min_capacity >= 0);
    nrow_ = nrow;
    colptr_.resize(ncol+1);
    colptr_.shrink_to_fit();
    std::fill(colptr_.begin(), colptr_.end(), 0);
    rowidx_.resize(min_capacity);
    rowidx_.shrink_to_fit();
    values_.resize(min_capacity);
    values_.shrink_to_fit();
}